

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::Identifier,_8UL>::~ArrayWithPreallocation
          (ArrayWithPreallocation<soul::Identifier,_8UL> *this)

{
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (Identifier *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Identifier *)this->space;
    this->numAllocated = 8;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }